

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void __thiscall Assimp::glTFExporter::ExportScene(glTFExporter *this)

{
  pointer *ppRVar1;
  element_type *peVar2;
  Scene *pSVar3;
  iterator __position;
  Ref<glTF::Scene> RVar4;
  Ref<glTF::Node> local_28;
  
  RVar4 = glTF::LazyDict<glTF::Scene>::Create
                    (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->scenes,"defaultScene");
  peVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)((ulong)((long)*(pointer *)
                           ((long)&(peVar2->nodes).mObjs.
                                   super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   (long)(peVar2->nodes).mObjs.
                         super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    local_28.vector = &(peVar2->nodes).mObjs;
    pSVar3 = ((RVar4.vector)->super__Vector_base<glTF::Scene_*,_std::allocator<glTF::Scene_*>_>).
             _M_impl.super__Vector_impl_data._M_start[RVar4.index];
    local_28.index = 0;
    __position._M_current =
         *(pointer *)
          ((long)&(pSVar3->nodes).
                  super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                  ._M_impl + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&(pSVar3->nodes).
                 super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
                 _M_impl + 0x10)) {
      std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
      _M_realloc_insert<glTF::Ref<glTF::Node>>
                ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
                 &pSVar3->nodes,__position,&local_28);
    }
    else {
      (__position._M_current)->vector = local_28.vector;
      *(ulong *)&(__position._M_current)->index = (ulong)(uint)local_28._12_4_ << 0x20;
      ppRVar1 = (pointer *)
                ((long)&(pSVar3->nodes).
                        super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                        ._M_impl + 8);
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  peVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->scene).vector = RVar4.vector;
  (peVar2->scene).index = RVar4.index;
  return;
}

Assistant:

void glTFExporter::ExportScene()
{
    const char* sceneName = "defaultScene";
    Ref<Scene> scene = mAsset->scenes.Create(sceneName);

    // root node will be the first one exported (idx 0)
    if (mAsset->nodes.Size() > 0) {
        scene->nodes.push_back(mAsset->nodes.Get(0u));
    }

    // set as the default scene
    mAsset->scene = scene;
}